

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_audio_buffer_ref_get_available_frames
                    (ma_audio_buffer_ref *pAudioBufferRef,ma_uint64 *pAvailableFrames)

{
  ma_result mVar1;
  ma_uint64 mVar2;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pAvailableFrames != (ma_uint64 *)0x0) &&
     (*pAvailableFrames = 0, pAudioBufferRef != (ma_audio_buffer_ref *)0x0)) {
    mVar1 = MA_SUCCESS;
    mVar2 = 0;
    if (pAudioBufferRef->cursor <= pAudioBufferRef->sizeInFrames) {
      mVar2 = pAudioBufferRef->sizeInFrames - pAudioBufferRef->cursor;
    }
    *pAvailableFrames = mVar2;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_audio_buffer_ref_get_available_frames(const ma_audio_buffer_ref* pAudioBufferRef, ma_uint64* pAvailableFrames)
{
    if (pAvailableFrames == NULL) {
        return MA_INVALID_ARGS;
    }

    *pAvailableFrames = 0;

    if (pAudioBufferRef == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pAudioBufferRef->sizeInFrames <= pAudioBufferRef->cursor) {
        *pAvailableFrames = 0;
    } else {
        *pAvailableFrames = pAudioBufferRef->sizeInFrames - pAudioBufferRef->cursor;
    }

    return MA_SUCCESS;
}